

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

void SimpleBVH::point_triangle_squared_distance
               (VectorMax3d *x,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> *f,VectorMax3d *pt,
               double *dist)

{
  MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *other;
  MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *this;
  ReturnType RVar1;
  ReturnType RVar2;
  RealScalar RVar3;
  ReturnType RVar4;
  ReturnType RVar5;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_4d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_4c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_498;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_470;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_438;
  double local_3c8;
  double w;
  double v;
  double denom;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_398;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_380;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_340;
  double local_2f0;
  double w_2;
  double va;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_2c8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_2a0;
  double local_268;
  double w_1;
  double vb;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_240;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  local_218;
  double local_1e0;
  double v_1;
  double vc;
  ReturnType local_1b8;
  double d6;
  double d5;
  Matrix<double,_1,1,0,3,1> local_190 [8];
  VectorMax3d cx;
  double d4;
  double d3;
  Matrix<double,_1,1,0,3,1> local_130 [8];
  VectorMax3d bx;
  double d2;
  double d1;
  Matrix<double,_1,1,0,3,1> local_d0 [8];
  VectorMax3d ax;
  Matrix<double,_1,1,0,3,1> local_98 [8];
  VectorMax3d ac;
  Matrix<double,_1,1,0,3,1> local_60 [8];
  VectorMax3d ab;
  VectorMax3d *pc;
  VectorMax3d *pb;
  VectorMax3d *pa;
  double *dist_local;
  VectorMax3d *pt_local;
  array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> *f_local;
  VectorMax3d *x_local;
  
  other = (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
          std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_3UL>::operator[](f,0);
  this = (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
         std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_3UL>::operator[](f,1);
  ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows =
       (Index)std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_3UL>::operator[](f,2);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows,
             this,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)other);
  Eigen::Matrix<double,-1,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
            (local_60,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                       *)&ac.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_rows);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows,
             (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
             ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)other);
  Eigen::Matrix<double,-1,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
            (local_98,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                       *)&ax.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
                          .m_rows);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&d1,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)other);
  Eigen::Matrix<double,-1,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
            (local_d0,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                       *)&d1);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::dot<Eigen::Matrix<double,_1,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_60,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_d0);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::dot<Eigen::Matrix<double,_1,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_98,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_d0);
  if ((0.0 < RVar1) || (0.0 < RVar2)) {
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                *)&d3,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)this);
    Eigen::Matrix<double,-1,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
              (local_130,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                *)&d3);
    RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
            dot<Eigen::Matrix<double,_1,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_60,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_130);
    RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
            dot<Eigen::Matrix<double,_1,1,0,3,1>>
                      ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_98,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_130);
    if ((RVar4 < 0.0) || (RVar4 < RVar5)) {
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                  *)&d5,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)
                 ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows);
      Eigen::Matrix<double,-1,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                (local_190,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                  *)&d5);
      d6 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
           dot<Eigen::Matrix<double,_1,1,0,3,1>>
                     ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_60,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_190);
      local_1b8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::
                  dot<Eigen::Matrix<double,_1,1,0,3,1>>
                            ((MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_98,
                             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)local_190);
      if ((local_1b8 < 0.0) || (local_1b8 < d6)) {
        v_1 = RVar1 * RVar5 + -(RVar4 * RVar2);
        if ((0.0 < v_1) || ((RVar1 < 0.0 || (0.0 < RVar4)))) {
          w_1 = d6 * RVar2 + -(RVar1 * local_1b8);
          if ((0.0 < w_1) || ((RVar2 < 0.0 || (0.0 < local_1b8)))) {
            w_2 = RVar4 * local_1b8 + -(d6 * RVar5);
            if ((0.0 < w_2) || ((RVar5 - RVar4 < 0.0 || (d6 - local_1b8 < 0.0)))) {
              v = 1.0 / (w_2 + w_1 + v_1);
              w = w_1 * v;
              local_3c8 = v_1 * v;
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator*
                        (&local_498,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_60,&w);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator+
                        (&local_470,other,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                          *)&local_498);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator*
                        (&local_4c0,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_98,
                         &local_3c8);
              Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,3,1>const>const>const>>
              ::operator+(&local_438,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>const>>
                           *)&local_470,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                           *)&local_4c0);
              Eigen::Matrix<double,-1,1,0,3,1>::operator=
                        ((Matrix<double,_1,1,0,3,1> *)pt,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>_>
                          *)&local_438);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                        (&local_4d8,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
              RVar3 = Eigen::
                      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                      ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                     *)&local_4d8);
              *dist = RVar3;
            }
            else {
              local_2f0 = (RVar5 - RVar4) / ((RVar5 - RVar4) + (d6 - local_1b8));
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                        (&local_398,
                         (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
                         ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                         m_rows,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)this);
              Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>
              ::operator*(&local_380,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                           *)&local_398,&local_2f0);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator+
                        (&local_340,this,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                          *)&local_380);
              Eigen::Matrix<double,-1,1,0,3,1>::operator=
                        ((Matrix<double,_1,1,0,3,1> *)pt,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>_>
                          *)&local_340);
              Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                        ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                          *)&denom,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
              RVar3 = Eigen::
                      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                      ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                     *)&denom);
              *dist = RVar3;
            }
          }
          else {
            local_268 = RVar2 / (RVar2 - local_1b8);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator*
                      (&local_2c8,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_98,
                       &local_268);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator+
                      (&local_2a0,other,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                        *)&local_2c8);
            Eigen::Matrix<double,-1,1,0,3,1>::operator=
                      ((Matrix<double,_1,1,0,3,1> *)pt,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>_>
                        *)&local_2a0);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                        *)&va,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
            RVar3 = Eigen::
                    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                    ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                   *)&va);
            *dist = RVar3;
          }
        }
        else {
          local_1e0 = RVar1 / (RVar1 - RVar4);
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator*
                    (&local_240,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)local_60,&local_1e0)
          ;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator+
                    (&local_218,other,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                      *)&local_240);
          Eigen::Matrix<double,-1,1,0,3,1>::operator=
                    ((Matrix<double,_1,1,0,3,1> *)pt,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>_>
                      *)&local_218);
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                    ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                      *)&vb,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
          RVar3 = Eigen::
                  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                  ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                                 *)&vb);
          *dist = RVar3;
        }
      }
      else {
        Eigen::Matrix<double,_-1,_1,_0,_3,_1>::operator=
                  (pt,(Matrix<double,__1,_1,_0,_3,_1> *)
                      ab.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                      m_rows);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                    *)&vc,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
        RVar3 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
                ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                               *)&vc);
        *dist = RVar3;
      }
    }
    else {
      Eigen::Matrix<double,_-1,_1,_0,_3,_1>::operator=(pt,(Matrix<double,__1,_1,_0,_3,_1> *)this);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                  *)&cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                     m_rows,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
      RVar3 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
              ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                             *)&cx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                                m_storage.m_rows);
      *dist = RVar3;
    }
  }
  else {
    Eigen::Matrix<double,_-1,_1,_0,_3,_1>::operator=(pt,(Matrix<double,__1,_1,_0,_3,_1> *)other);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                *)&bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
               ,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)x,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)pt);
    RVar3 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
            ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                           *)&bx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                              m_storage.m_rows);
    *dist = RVar3;
  }
  return;
}

Assistant:

void point_triangle_squared_distance(
    const VectorMax3d& x,
    const std::array<VectorMax3d, 3>& f,
    VectorMax3d& pt,
    double& dist)
{
    const VectorMax3d& pa = f[0];
    const VectorMax3d& pb = f[1];
    const VectorMax3d& pc = f[2];

    // source: real time collision detection
    // check if x in vertex region outside pa
    VectorMax3d ab = pb - pa;
    VectorMax3d ac = pc - pa;
    VectorMax3d ax = x - pa;
    const double d1 = ab.dot(ax);
    const double d2 = ac.dot(ax);
    if (d1 <= 0 && d2 <= 0) {
        // barycentric coordinates (1, 0, 0)
        pt = pa;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pb
    VectorMax3d bx = x - pb;
    const double d3 = ab.dot(bx);
    const double d4 = ac.dot(bx);
    if (d3 >= 0.0f && d4 <= d3) {
        // barycentric coordinates (0, 1, 0)
        pt = pb;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in vertex region outside pc
    VectorMax3d cx = x - pc;
    const double d5 = ab.dot(cx);
    const double d6 = ac.dot(cx);
    if (d6 >= 0.0f && d5 <= d6) {
        // barycentric coordinates (0, 0, 1)
        pt = pc;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ab, if so return projection of x onto ab
    const double vc = d1 * d4 - d3 * d2;
    if (vc <= 0.0f && d1 >= 0.0f && d3 <= 0.0f) {
        // barycentric coordinates (1 - v, v, 0)
        const double v = d1 / (d1 - d3);
        pt = pa + ab * v;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of ac, if so return projection of x onto ac
    const double vb = d5 * d2 - d1 * d6;
    if (vb <= 0.0f && d2 >= 0.0f && d6 <= 0.0f) {
        // barycentric coordinates (1 - w, 0, w)
        const double w = d2 / (d2 - d6);
        pt = pa + ac * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // check if x in edge region of bc, if so return projection of x onto bc
    const double va = d3 * d6 - d5 * d4;
    if (va <= 0.0f && (d4 - d3) >= 0.0f && (d5 - d6) >= 0.0f) {
        // barycentric coordinates (0, 1 - w, w)
        const double w = (d4 - d3) / ((d4 - d3) + (d5 - d6));
        pt = pb + (pc - pb) * w;
        dist = (x - pt).squaredNorm();
        return;
    }

    // x inside face region. Compute pt through its barycentric coordinates (u,
    // v, w)
    const double denom = 1 / (va + vb + vc);
    const double v = vb * denom;
    const double w = vc * denom;

    pt = pa + ab * v + ac * w; //= u*a + v*b + w*c, u = va*denom = 1.0f - v - w
    dist = (x - pt).squaredNorm();
}